

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

float __thiscall Search::action_cost_loss(Search *this,action a,action *act,float *costs,size_t sz)

{
  long lVar1;
  vw_exception *this_00;
  int iVar2;
  undefined4 in_register_00000034;
  int *piVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  float in_XMM0_Da;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  piVar3 = (int *)CONCAT44(in_register_00000034,a);
  iVar2 = (int)this;
  if (piVar3 == (int *)0x0) {
    in_XMM0_Da = (float)act[iVar2 - 1];
  }
  else {
    bVar6 = costs != (float *)0x0;
    if (bVar6) {
      if (*piVar3 == iVar2) {
        pfVar4 = (float *)0x0;
      }
      else {
        pfVar5 = (float *)0x0;
        do {
          if ((float *)((long)costs - 1U) == pfVar5) {
            bVar6 = false;
            goto LAB_0012b3da;
          }
          pfVar4 = (float *)((long)pfVar5 + 1);
          lVar1 = (long)pfVar5 + 1;
          pfVar5 = pfVar4;
        } while (piVar3[lVar1] != iVar2);
        bVar6 = pfVar4 < costs;
      }
      in_XMM0_Da = (float)act[(long)pfVar4];
    }
LAB_0012b3da:
    if (!bVar6) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,"action_cost_loss got action that wasn\'t allowed: ",0x31);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xb87,&local_1c0);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  return in_XMM0_Da;
}

Assistant:

float action_cost_loss(action a, const action* act, const float* costs, size_t sz)
{
  if (act == nullptr)
    return costs[a - 1];
  for (size_t i = 0; i < sz; i++)
    if (act[i] == a)
      return costs[i];
  THROW("action_cost_loss got action that wasn't allowed: " << a);
}